

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyTable.c
# Opt level: O0

void Ivy_TableInsert(Ivy_Man_t *p,Ivy_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *pPlace;
  Ivy_Obj_t *pObj_local;
  Ivy_Man_t *p_local;
  
  iVar1 = Ivy_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyTable.c"
                  ,0x6c,"void Ivy_TableInsert(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  iVar1 = Ivy_ObjIsHash(pObj);
  if (iVar1 != 0) {
    if (((pObj->Id & 0x3fU) == 0) &&
       (iVar1 = p->nTableSize, iVar2 = Ivy_ManHashObjNum(p),
       SBORROW4(iVar1,iVar2 * 2) != iVar1 + iVar2 * -2 < 0)) {
      Ivy_TableResize(p);
    }
    piVar3 = Ivy_TableFind(p,pObj);
    if (*piVar3 != 0) {
      __assert_fail("*pPlace == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyTable.c"
                    ,0x75,"void Ivy_TableInsert(Ivy_Man_t *, Ivy_Obj_t *)");
    }
    *piVar3 = pObj->Id;
  }
  return;
}

Assistant:

void Ivy_TableInsert( Ivy_Man_t * p, Ivy_Obj_t * pObj )
{
    int * pPlace;
    assert( !Ivy_IsComplement(pObj) );
    if ( !Ivy_ObjIsHash(pObj) )
        return;
    if ( (pObj->Id & 63) == 0 )
    {
        if ( p->nTableSize < 2 * Ivy_ManHashObjNum(p) )
            Ivy_TableResize( p );
    }
    pPlace = Ivy_TableFind( p, pObj );
    assert( *pPlace == 0 );
    *pPlace = pObj->Id;
}